

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockingPriorityQueue.hpp
# Opt level: O2

optional<std::pair<helics::route_id,_helics::ActionMessage>_> * __thiscall
gmlc::containers::
BlockingPriorityQueue<std::pair<helics::route_id,helics::ActionMessage>,std::mutex,std::condition_variable>
::pop<std::chrono::duration<long,std::ratio<1l,1000l>>>
          (optional<std::pair<helics::route_id,_helics::ActionMessage>_> *__return_storage_ptr__,
          BlockingPriorityQueue<std::pair<helics::route_id,helics::ActionMessage>,std::mutex,std::condition_variable>
          *this,duration<long,_std::ratio<1L,_1000L>_> timeout)

{
  cv_status cVar1;
  pair<helics::route_id,_helics::ActionMessage> *__u;
  long lVar2;
  unique_lock<std::mutex> pullLock;
  duration<long,_std::ratio<1L,_1000L>_> local_110;
  unique_lock<std::mutex> local_108;
  _Optional_payload_base<std::pair<helics::route_id,_helics::ActionMessage>_> local_f8;
  
  local_110.__r = timeout.__r;
  BlockingPriorityQueue<std::pair<helics::route_id,_helics::ActionMessage>,_std::mutex,_std::condition_variable>
  ::try_pop(__return_storage_ptr__,
            (BlockingPriorityQueue<std::pair<helics::route_id,_helics::ActionMessage>,_std::mutex,_std::condition_variable>
             *)this);
  while( true ) {
    if ((__return_storage_ptr__->
        super__Optional_base<std::pair<helics::route_id,_helics::ActionMessage>,_false,_false>).
        _M_payload.
        super__Optional_payload<std::pair<helics::route_id,_helics::ActionMessage>,_true,_false,_false>
        .super__Optional_payload_base<std::pair<helics::route_id,_helics::ActionMessage>_>.
        _M_engaged != false) {
      return __return_storage_ptr__;
    }
    std::unique_lock<std::mutex>::unique_lock(&local_108,(mutex_type *)(this + 0x28));
    __u = *(pair<helics::route_id,_helics::ActionMessage> **)(this + 0x98);
    if (*(pair<helics::route_id,_helics::ActionMessage> **)(this + 0xb8) != __u) break;
    lVar2 = *(long *)(this + 0x70);
    if (*(long *)(this + 0x68) != lVar2) {
LAB_0026b5da:
      std::optional<std::pair<helics::route_id,helics::ActionMessage>>::operator=
                ((optional<std::pair<helics::route_id,helics::ActionMessage>> *)
                 __return_storage_ptr__,
                 (pair<helics::route_id,_helics::ActionMessage> *)(lVar2 + -0xc0));
      std::
      vector<std::pair<helics::route_id,_helics::ActionMessage>,_std::allocator<std::pair<helics::route_id,_helics::ActionMessage>_>_>
      ::pop_back((vector<std::pair<helics::route_id,_helics::ActionMessage>,_std::allocator<std::pair<helics::route_id,_helics::ActionMessage>_>_>
                  *)(this + 0x68));
      goto LAB_0026b5f3;
    }
    cVar1 = std::condition_variable::wait_for<long,std::ratio<1l,1000l>>
                      ((condition_variable *)(this + 0xd8),&local_108,&local_110);
    __u = *(pair<helics::route_id,_helics::ActionMessage> **)(this + 0x98);
    if (*(pair<helics::route_id,_helics::ActionMessage> **)(this + 0xb8) != __u) break;
    lVar2 = *(long *)(this + 0x70);
    if (*(long *)(this + 0x68) != lVar2) goto LAB_0026b5da;
    std::unique_lock<std::mutex>::unlock(&local_108);
    BlockingPriorityQueue<std::pair<helics::route_id,_helics::ActionMessage>,_std::mutex,_std::condition_variable>
    ::try_pop((optional<std::pair<helics::route_id,_helics::ActionMessage>_> *)&local_f8,
              (BlockingPriorityQueue<std::pair<helics::route_id,_helics::ActionMessage>,_std::mutex,_std::condition_variable>
               *)this);
    std::_Optional_payload_base<std::pair<helics::route_id,_helics::ActionMessage>_>::_M_move_assign
              ((_Optional_payload_base<std::pair<helics::route_id,_helics::ActionMessage>_> *)
               __return_storage_ptr__,&local_f8);
    std::_Optional_payload_base<std::pair<helics::route_id,_helics::ActionMessage>_>::_M_reset
              (&local_f8);
    std::unique_lock<std::mutex>::~unique_lock(&local_108);
    if (cVar1 != no_timeout) {
      return __return_storage_ptr__;
    }
  }
  std::optional<std::pair<helics::route_id,helics::ActionMessage>>::operator=
            ((optional<std::pair<helics::route_id,helics::ActionMessage>> *)__return_storage_ptr__,
             __u);
  std::
  deque<std::pair<helics::route_id,_helics::ActionMessage>,_std::allocator<std::pair<helics::route_id,_helics::ActionMessage>_>_>
  ::pop_front((deque<std::pair<helics::route_id,_helics::ActionMessage>,_std::allocator<std::pair<helics::route_id,_helics::ActionMessage>_>_>
               *)(this + 0x88));
LAB_0026b5f3:
  std::unique_lock<std::mutex>::~unique_lock(&local_108);
  return __return_storage_ptr__;
}

Assistant:

std::optional<T> pop(TIME timeout)
        {
            auto val = try_pop();
            while (!val) {
                std::unique_lock<MUTEX> pullLock(
                    m_pullLock);  // get the lock then wait
                if (!priorityQueue.empty()) {
                    val = std::move(priorityQueue.front());
                    priorityQueue.pop();
                    break;
                }
                if (!pullElements.empty())  // make sure we are actually empty;
                {
                    val = std::move(pullElements.back());
                    pullElements.pop_back();
                    break;
                }
                auto res = condition.wait_for(pullLock, timeout);  // now wait

                if (!priorityQueue.empty()) {
                    val = std::move(priorityQueue.front());
                    priorityQueue.pop();
                    break;
                }
                if (!pullElements.empty())  // check for spurious wake-ups
                {
                    val = std::move(pullElements.back());
                    pullElements.pop_back();
                    break;
                }
                pullLock.unlock();
                val = try_pop();
                if (res !=
                    std::cv_status::no_timeout)  // std::cv_status::no_timeout
                {
                    break;
                }
            }
            // move the value out of the optional
            return val;
        }